

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

void dictionary_unset(dictionary *d,char *key)

{
  long lVar1;
  char **ppcVar2;
  char *__s2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  if (d != (dictionary *)0x0 && key != (char *)0x0) {
    uVar3 = dictionary_hash(key);
    lVar1 = d->size;
    if (0 < lVar1) {
      ppcVar2 = d->key;
      lVar5 = 0;
      do {
        __s2 = ppcVar2[lVar5];
        if (((__s2 != (char *)0x0) && (uVar3 == d->hash[lVar5])) &&
           (iVar4 = strcmp(key,__s2), iVar4 == 0)) {
          free(__s2);
          d->key[lVar5] = (char *)0x0;
          if (d->val[lVar5] != (char *)0x0) {
            free(d->val[lVar5]);
            d->val[lVar5] = (char *)0x0;
          }
          d->hash[lVar5] = 0;
          d->n = d->n + -1;
          return;
        }
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
    }
  }
  return;
}

Assistant:

void dictionary_unset(dictionary * d, const char * key)
{
    unsigned    hash ;
    ssize_t      i ;

    if (key == NULL || d == NULL) {
        return;
    }

    hash = dictionary_hash(key);
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i] == NULL)
            continue ;
        /* Compare hash */
        if (hash == d->hash[i]) {
            /* Compare string, to avoid hash collisions */
            if (!strcmp(key, d->key[i])) {
                /* Found key */
                break ;
            }
        }
    }
    if (i >= d->size)
        /* Key not found */
        return ;

    free(d->key[i]);
    d->key[i] = NULL ;
    if (d->val[i] != NULL) {
        free(d->val[i]);
        d->val[i] = NULL ;
    }
    d->hash[i] = 0 ;
    d->n -- ;
    return ;
}